

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_TranslucentLine(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  int iVar1;
  int iVar2;
  int linenum;
  FLineIdIterator itr;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr.searchtag = arg2;
  itr.start = arg1;
  FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffd0,arg0);
  while (iVar1 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffd0), -1 < iVar1) {
    iVar2 = clamp<int>(itr.start,0,0xff);
    lines[iVar1].alpha = (double)iVar2 / 255.0;
    if (itr.searchtag == 0) {
      lines[iVar1].flags = lines[iVar1].flags & 0xfffffbff;
    }
    else if (itr.searchtag == 1) {
      lines[iVar1].flags = lines[iVar1].flags | 0x400;
    }
    else {
      Printf("Unknown translucency type used with TranslucentLine\n");
    }
  }
  return 1;
}

Assistant:

FUNC(LS_TranslucentLine)
// TranslucentLine (id, amount, type)
{
	FLineIdIterator itr(arg0);
	int linenum;
	while ((linenum = itr.Next()) >= 0)
	{
		lines[linenum].alpha = clamp(arg1, 0, 255) / 255.;
		if (arg2 == 0)
		{
			lines[linenum].flags &= ~ML_ADDTRANS;
		}
		else if (arg2 == 1)
		{
			lines[linenum].flags |= ML_ADDTRANS;
		}
		else
		{
			Printf ("Unknown translucency type used with TranslucentLine\n");
		}
	}

	return true;
}